

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8_t *ptr)

{
  int iVar1;
  uint8_t *puVar2;
  size_t __n;
  
  do {
    puVar2 = this->end_;
    if (this->buffer_end_ == (uint8_t *)0x0) {
      iVar1 = ((int)puVar2 - (int)ptr) + 0x10;
      this->buffer_end_ = ptr;
LAB_002d28ee:
      if (-1 < iVar1) {
        return iVar1;
      }
LAB_002d290c:
      Flush((EpsCopyOutputStream *)&stack0xffffffffffffffd8);
    }
    if (ptr < puVar2 || (long)ptr - (long)puVar2 == 0) {
      __n = (long)ptr - (long)this->buffer_;
      memcpy(this->buffer_end_,this->buffer_,__n);
      this->buffer_end_ = this->buffer_end_ + __n;
      iVar1 = (int)this->end_ - (int)ptr;
      goto LAB_002d28ee;
    }
    if (this->had_error_ == true) {
      Flush((EpsCopyOutputStream *)&stack0xffffffffffffffd8);
LAB_002d2904:
      Flush((EpsCopyOutputStream *)&stack0xffffffffffffffd8);
      goto LAB_002d290c;
    }
    iVar1 = (int)((long)ptr - (long)puVar2);
    if (0x10 < iVar1) goto LAB_002d2904;
    puVar2 = Next(this);
    ptr = puVar2 + iVar1;
    if (this->had_error_ != false) {
      return 0;
    }
  } while( true );
}

Assistant:

int EpsCopyOutputStream::Flush(uint8_t* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    ABSL_DCHECK(!had_error_);
    ABSL_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  ABSL_DCHECK(s >= 0);  // NOLINT
  return s;
}